

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall vm::VM::Tastore<int>(VM *this)

{
  int_t value;
  int_t iVar1;
  int_t iVar2;
  
  value = POP<int>(this);
  iVar1 = POP<int>(this);
  iVar2 = POP<int>(this);
  WRITE<int>(this,iVar1 + iVar2,value);
  return;
}

Assistant:

void VM::Tastore() {
    auto value = POP<T>();
    addr_t addr = slots_count<T> * POP<addr_t>();
    addr += POP<addr_t>();
    WRITE(addr, value);
}